

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_get_remote_channel(BEGIN_HANDLE begin,uint16_t *remote_channel_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  BEGIN_INSTANCE *begin_instance;
  uint32_t item_count;
  int result;
  uint16_t *remote_channel_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0xa53;
  }
  else {
    _item_count = remote_channel_value;
    remote_channel_value_local = (uint16_t *)begin;
    iVar1 = amqpvalue_get_composite_item_count(begin->composite_value,(uint32_t *)&begin_instance);
    if (iVar1 == 0) {
      if ((int)begin_instance == 0) {
        begin_instance._4_4_ = 0xa61;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(begin->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          begin_instance._4_4_ = 0xa69;
        }
        else {
          iVar1 = amqpvalue_get_ushort(value,_item_count);
          if (iVar1 == 0) {
            begin_instance._4_4_ = 0;
          }
          else {
            begin_instance._4_4_ = 0xa70;
          }
        }
      }
    }
    else {
      begin_instance._4_4_ = 0xa5b;
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int begin_get_remote_channel(BEGIN_HANDLE begin, uint16_t* remote_channel_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        if (amqpvalue_get_composite_item_count(begin_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(begin_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_ushort(item_value, remote_channel_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}